

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1e8ba::CpuTest_pla_sets_n_clears_z_Test::~CpuTest_pla_sets_n_clears_z_Test
          (CpuTest_pla_sets_n_clears_z_Test *this)

{
  CpuTest_pla_sets_n_clears_z_Test *this_local;
  
  ~CpuTest_pla_sets_n_clears_z_Test(this);
  operator_delete(this,0x118);
  return;
}

Assistant:

TEST_F(CpuTest, pla_sets_n_clears_z) {
    stage_instruction(PLA);
    registers.sp = 0x0A;
    registers.a = 0xBB;
    registers.p = Z_FLAG;

    expected.sp = registers.sp + static_cast<uint8_t>(1u);
    expected.a = 0x92;
    expected.p = N_FLAG;

    // Dummy read
    EXPECT_CALL(mmu, read_byte(expected.pc));
    EXPECT_CALL(mmu, read_byte(kStackOffset + expected.sp))
            .WillOnce(Return(0x92));

    step_execution(4);
    EXPECT_EQ(expected, registers);
}